

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  cmPropertyMap *this_00;
  cmTarget *pcVar1;
  pointer pbVar2;
  bool bVar3;
  const_iterator cVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  pointer str1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propsToExport;
  string evaluatedValue;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  ImportPropertyMap *local_1f0;
  string local_1e8;
  allocator<char> local_1c8 [32];
  ostream local_1a8;
  
  pcVar1 = gte->Target;
  local_1f0 = properties;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"EXPORT_PROPERTIES",(allocator<char> *)&local_1e8);
  this_00 = &pcVar1->Properties;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  *)this_00,(key_type *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if ((_Rb_tree_header *)cVar4._M_node !=
      &(pcVar1->Properties).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar5 = cmProperty::GetValue((cmProperty *)(cVar4._M_node + 2));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar5,(allocator<char> *)&local_1e8);
    cmSystemTools::ExpandListArgument((string *)&local_1a8,&local_208,false);
    std::__cxx11::string::~string((string *)&local_1a8);
    pbVar2 = local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (str1 = local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; str1 != pbVar2; str1 = str1 + 1) {
      bVar3 = cmsys::SystemTools::StringStartsWith(str1,"IMPORTED_");
      if ((bVar3) || (bVar3 = cmsys::SystemTools::StringStartsWith(str1,"INTERFACE_"), bVar3)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar7 = std::operator<<(&local_1a8,"Target \"");
        poVar7 = std::operator<<(poVar7,(string *)&gte->Target->Name);
        poVar7 = std::operator<<(poVar7,"\" contains property \"");
        poVar7 = std::operator<<(poVar7,(string *)str1);
        poVar7 = std::operator<<(poVar7,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ");
        std::operator<<(poVar7,"properties are reserved.");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00273522:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_208);
        return false;
      }
      pcVar5 = cmPropertyMap::GetPropertyValue(this_00,str1);
      if (pcVar5 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar5,local_1c8);
        cmGeneratorExpression::Preprocess
                  (&local_1e8,(string *)&local_1a8,StripAllGeneratorExpressions,false);
        std::__cxx11::string::~string((string *)&local_1a8);
        bVar3 = std::operator!=(&local_1e8,pcVar5);
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar7 = std::operator<<(&local_1a8,"Target \"");
          poVar7 = std::operator<<(poVar7,(string *)&gte->Target->Name);
          poVar7 = std::operator<<(poVar7,"\" contains property \"");
          poVar7 = std::operator<<(poVar7,(string *)str1);
          poVar7 = std::operator<<(poVar7,"\" in EXPORT_PROPERTIES but this property contains a ");
          std::operator<<(poVar7,"generator expression. This is not allowed.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)errorMessage,(string *)local_1c8);
          std::__cxx11::string::~string((string *)local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1e8);
          goto LAB_00273522;
        }
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_1f0,str1);
        std::__cxx11::string::assign((char *)pmVar6);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  auto& targetProperties = gte->Target->GetProperties();
  const auto& exportProperties = targetProperties.find("EXPORT_PROPERTIES");
  if (exportProperties != targetProperties.end()) {
    std::vector<std::string> propsToExport;
    cmSystemTools::ExpandListArgument(exportProperties->second.GetValue(),
                                      propsToExport);
    for (auto& prop : propsToExport) {
      /* Black list reserved properties */
      if (cmSystemTools::StringStartsWith(prop, "IMPORTED_") ||
          cmSystemTools::StringStartsWith(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      auto propertyValue = targetProperties.GetPropertyValue(prop);
      if (propertyValue == nullptr) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = propertyValue;
    }
  }
  return true;
}